

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

void __thiscall SHA256::transform(SHA256 *this,uchar *message,uint block_nb)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint local_178 [9];
  int aiStack_154 [5];
  uint local_140 [68];
  
  uVar1 = 0;
  uVar4 = (ulong)block_nb;
  if ((int)block_nb < 1) {
    uVar4 = uVar1;
  }
  for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      uVar5 = *(uint *)(message + lVar2 * 4 + (long)(int)uVar1);
      local_140[lVar2 + 2] =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
    for (lVar2 = 0x10; lVar2 != 0x40; lVar2 = lVar2 + 1) {
      uVar5 = local_140[lVar2];
      uVar6 = local_178[lVar2 + 1];
      local_140[lVar2 + 2] =
           (uVar5 >> 10 ^ (uVar5 << 0xd | uVar5 >> 0x13) ^ (uVar5 << 0xf | uVar5 >> 0x11)) +
           aiStack_154[lVar2] + local_178[lVar2] +
           (uVar6 >> 3 ^ (uVar6 << 0xe | uVar6 >> 0x12) ^ (uVar6 << 0x19 | uVar6 >> 7));
    }
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      local_178[lVar2] = this->m_h[lVar2];
    }
    for (lVar2 = 0; uVar5 = local_178[2], local_178[2] = local_178[1], local_178[1] = local_178[0],
        uVar6 = local_178[5], local_178[5] = local_178[4], lVar2 != 0x100; lVar2 = lVar2 + 4) {
      iVar7 = ((local_178[5] << 7 | local_178[5] >> 0x19) ^
              (local_178[5] << 0x15 | local_178[5] >> 0xb) ^
              (local_178[5] << 0x1a | local_178[5] >> 6)) + local_178[7] +
              *(int *)((long)sha256_k + lVar2) +
              ((uVar6 ^ local_178[6]) & local_178[5] ^ local_178[6]) +
              *(int *)((long)local_140 + lVar2 + 8);
      local_178[7] = local_178[6];
      local_178[4] = local_178[3] + iVar7;
      local_178[6] = uVar6;
      local_178[0] = (uVar5 & local_178[2] ^ (uVar5 ^ local_178[2]) & local_178[1]) +
                     ((local_178[1] << 10 | local_178[1] >> 0x16) ^
                     (local_178[1] << 0x13 | local_178[1] >> 0xd) ^
                     (local_178[1] << 0x1e | local_178[1] >> 2)) + iVar7;
      local_178[3] = uVar5;
    }
    local_178[4] = local_178[5];
    local_178[5] = uVar6;
    local_178[0] = local_178[1];
    local_178[1] = local_178[2];
    local_178[2] = uVar5;
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      this->m_h[lVar2] = this->m_h[lVar2] + local_178[lVar2];
    }
    uVar1 = (ulong)((int)uVar1 + 0x40);
  }
  return;
}

Assistant:

void SHA256::transform(const unsigned char *message, unsigned int block_nb)
{
    uint32 w[64];
    uint32 wv[8];
    uint32 t1, t2;
    const unsigned char *sub_block;
    int i;
    int j;
    for (i = 0; i < (int) block_nb; i++) {
        sub_block = message + (i << 6);
        for (j = 0; j < 16; j++) {
            SHA2_PACK32(&sub_block[j << 2], &w[j]);
        }
        for (j = 16; j < 64; j++) {
            w[j] =  SHA256_F4(w[j -  2]) + w[j -  7] + SHA256_F3(w[j - 15]) + w[j - 16];
        }
        for (j = 0; j < 8; j++) {
            wv[j] = m_h[j];
        }
        for (j = 0; j < 64; j++) {
            t1 = wv[7] + SHA256_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                + sha256_k[j] + w[j];
            t2 = SHA256_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
            wv[7] = wv[6];
            wv[6] = wv[5];
            wv[5] = wv[4];
            wv[4] = wv[3] + t1;
            wv[3] = wv[2];
            wv[2] = wv[1];
            wv[1] = wv[0];
            wv[0] = t1 + t2;
        }
        for (j = 0; j < 8; j++) {
            m_h[j] += wv[j];
        }
    }
}